

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O1

Interface * __thiscall
gl4cts::EnhancedLayouts::Utils::ProgramInterface::GetBlock(ProgramInterface *this,GLchar *name)

{
  __normal_iterator<gl4cts::EnhancedLayouts::Utils::Interface_**,_std::vector<gl4cts::EnhancedLayouts::Utils::Interface_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Interface_*>_>_>
  _Var1;
  Interface *pIVar2;
  
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<gl4cts::EnhancedLayouts::Utils::Interface**,std::vector<gl4cts::EnhancedLayouts::Utils::Interface*,std::allocator<gl4cts::EnhancedLayouts::Utils::Interface*>>>,__gnu_cxx::__ops::_Iter_pred<gl4cts::EnhancedLayouts::Utils::matchInterfaceName>>
                    ((this->m_blocks).
                     super__Vector_base<gl4cts::EnhancedLayouts::Utils::Interface_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Interface_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->m_blocks).
                     super__Vector_base<gl4cts::EnhancedLayouts::Utils::Interface_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Interface_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,name);
  if ((this->m_blocks).
      super__Vector_base<gl4cts::EnhancedLayouts::Utils::Interface_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Interface_*>_>
      ._M_impl.super__Vector_impl_data._M_finish == _Var1._M_current) {
    pIVar2 = (Interface *)0x0;
  }
  else {
    pIVar2 = *_Var1._M_current;
  }
  return pIVar2;
}

Assistant:

Interface* ProgramInterface::GetBlock(const GLchar* name)
{
	return findInterfaceByName(m_blocks, name);
}